

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intelligibility_enhancer.cc
# Opt level: O0

void __thiscall
webrtc::IntelligibilityEnhancer::SolveForGainsGivenLambda
          (IntelligibilityEnhancer *this,float lambda,size_t start_freq,float *sols)

{
  float fVar1;
  float *pfVar2;
  double dVar3;
  float local_204;
  float local_200;
  float local_1fc;
  float local_1f8 [4];
  FatalMessage local_1e8;
  float local_6c;
  string *local_68;
  string *_result;
  float local_58;
  float alpha0;
  float beta0;
  float gamma0;
  size_t n_1;
  size_t n;
  float *pow_n0;
  float *pow_x0;
  float *pfStack_28;
  float kMinPower;
  float *sols_local;
  size_t start_freq_local;
  IntelligibilityEnhancer *pIStack_10;
  float lambda_local;
  IntelligibilityEnhancer *this_local;
  
  pow_x0._4_4_ = 0x3727c5ac;
  pfStack_28 = sols;
  sols_local = (float *)start_freq;
  start_freq_local._4_4_ = lambda;
  pIStack_10 = this;
  pow_n0 = std::vector<float,_std::allocator<float>_>::data(&this->filtered_clear_pow_);
  n = (size_t)std::vector<float,_std::allocator<float>_>::data(&this->filtered_noise_pow_);
  for (n_1 = 0; n_1 < sols_local; n_1 = n_1 + 1) {
    pfStack_28[n_1] = 1.0;
  }
  _beta0 = sols_local;
  do {
    if ((float *)this->bank_size_ <= _beta0) {
      return;
    }
    if ((pow_n0[(long)_beta0] <= 1e-05 && pow_n0[(long)_beta0] != 1e-05) ||
       (pfVar2 = (float *)(n + (long)_beta0 * 4), *pfVar2 <= 1e-05 && *pfVar2 != 1e-05)) {
      pfStack_28[(long)_beta0] = 1.0;
    }
    else {
      alpha0 = pow_n0[(long)_beta0] * 0.0002 * *(float *)(n + (long)_beta0 * 4) +
               start_freq_local._4_4_ * pow_n0[(long)_beta0] * *(float *)(n + (long)_beta0 * 4) *
               *(float *)(n + (long)_beta0 * 4);
      local_58 = start_freq_local._4_4_ * pow_n0[(long)_beta0] * 1.9996 * pow_n0[(long)_beta0] *
                 *(float *)(n + (long)_beta0 * 4);
      _result._4_4_ =
           start_freq_local._4_4_ * pow_n0[(long)_beta0] * 0.9996 * pow_n0[(long)_beta0] *
           pow_n0[(long)_beta0];
      local_6c = 0.0;
      local_68 = rtc::CheckLTImpl<float,float>
                           ((float *)((long)&_result + 4),&local_6c,"alpha0 < 0.f");
      if (local_68 != (string *)0x0) {
        rtc::FatalMessage::FatalMessage
                  (&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/intelligibility/intelligibility_enhancer.cc"
                   ,0x145,local_68);
        rtc::FatalMessage::stream(&local_1e8);
        rtc::FatalMessage::~FatalMessage(&local_1e8);
      }
      local_1f8[0] = 0.0;
      fVar1 = -local_58;
      local_200 = 0.0;
      local_204 = local_58 * local_58 + -(_result._4_4_ * 4.0 * alpha0);
      pfVar2 = std::max<float>(&local_200,&local_204);
      dVar3 = std::sqrt((double)(ulong)(uint)*pfVar2);
      local_1fc = (fVar1 - SUB84(dVar3,0)) / (_result._4_4_ * 2.0);
      pfVar2 = std::max<float>(local_1f8,&local_1fc);
      pfStack_28[(long)_beta0] = *pfVar2;
    }
    _beta0 = (float *)((long)_beta0 + 1);
  } while( true );
}

Assistant:

void IntelligibilityEnhancer::SolveForGainsGivenLambda(float lambda,
                                                       size_t start_freq,
                                                       float* sols) {
  const float kMinPower = 1e-5f;

  const float* pow_x0 = filtered_clear_pow_.data();
  const float* pow_n0 = filtered_noise_pow_.data();

  for (size_t n = 0; n < start_freq; ++n) {
    sols[n] = 1.f;
  }

  // Analytic solution for optimal gains. See paper for derivation.
  for (size_t n = start_freq; n < bank_size_; ++n) {
    if (pow_x0[n] < kMinPower || pow_n0[n] < kMinPower) {
      sols[n] = 1.f;
    } else {
      const float gamma0 = 0.5f * kRho * pow_x0[n] * pow_n0[n] +
                           lambda * pow_x0[n] * pow_n0[n] * pow_n0[n];
      const float beta0 =
          lambda * pow_x0[n] * (2.f - kRho) * pow_x0[n] * pow_n0[n];
      const float alpha0 =
          lambda * pow_x0[n] * (1.f - kRho) * pow_x0[n] * pow_x0[n];
      RTC_DCHECK_LT(alpha0, 0.f);
      // The quadratic equation should always have real roots, but to guard
      // against numerical errors we limit it to a minimum of zero.
      sols[n] = std::max(
          0.f, (-beta0 - std::sqrt(std::max(
                             0.f, beta0 * beta0 - 4.f * alpha0 * gamma0))) /
                   (2.f * alpha0));
    }
  }
}